

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementReader.cpp
# Opt level: O0

uint32 __thiscall
Js::
StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
::MoveNextStatementBoundary
          (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           *this)

{
  uint uVar1;
  byte *pbVar2;
  uint32 uVar3;
  BOOL BVar4;
  int iVar5;
  int iVar6;
  Type *pTVar7;
  StatementMap *pSVar8;
  StatementMap *nextMap;
  int nextInstrStart;
  uint32 retStatement;
  StatementData data;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *this_local;
  
  data = (StatementData)this;
  StatementData::StatementData((StatementData *)&nextInstrStart);
  nextMap._4_4_ = 0xffffffff;
  if ((this->m_startOfStatement & 1U) == 0) {
    this->m_startOfStatement = true;
    if (((this->m_statementMap == (SmallSpanSequence *)0x0) ||
        (uVar1 = this->m_statementIndex, uVar3 = SmallSpanSequence::Count(this->m_statementMap),
        uVar3 <= uVar1)) ||
       (BVar4 = SmallSpanSequence::Item
                          (this->m_statementMap,this->m_statementIndex,&this->m_statementMapIter,
                           (StatementData *)&nextInstrStart), BVar4 == 0)) {
      if ((this->m_fullstatementMap ==
           (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0) ||
         (iVar6 = this->m_statementIndex,
         iVar5 = JsUtil::
                 ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
                 Count(&this->m_fullstatementMap->
                        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                      ), iVar5 <= iVar6)) {
        this->m_nextStatementBoundary = this->m_startLocation + -1;
      }
      else {
        pSVar8 = FunctionBody::
                 GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                           (this->m_fullstatementMap,&this->m_statementIndex);
        if (pSVar8 == (StatementMap *)0x0) {
          this->m_nextStatementBoundary = this->m_startLocation + -1;
        }
        else {
          pbVar2 = this->m_startLocation;
          pTVar7 = JsUtil::
                   List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(this->m_fullstatementMap,this->m_statementIndex);
          pSVar8 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar7);
          this->m_nextStatementBoundary = pbVar2 + (pSVar8->byteCodeSpan).begin;
          nextMap._4_4_ = this->m_statementIndex;
        }
      }
    }
    else {
      this->m_nextStatementBoundary = this->m_startLocation + (int)retStatement;
      nextMap._4_4_ = this->m_statementIndex;
    }
  }
  else {
    this->m_statementIndex = this->m_statementIndex + 1;
    if (((this->m_statementMap == (SmallSpanSequence *)0x0) ||
        (uVar1 = this->m_statementIndex, uVar3 = SmallSpanSequence::Count(this->m_statementMap),
        uVar3 <= uVar1)) ||
       (BVar4 = SmallSpanSequence::Item
                          (this->m_statementMap,this->m_statementIndex,&this->m_statementMapIter,
                           (StatementData *)&nextInstrStart), BVar4 == 0)) {
      if ((this->m_fullstatementMap ==
           (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0) ||
         (iVar6 = this->m_statementIndex,
         iVar5 = JsUtil::
                 ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
                 Count(&this->m_fullstatementMap->
                        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                      ), iVar5 <= iVar6)) {
        this->m_startOfStatement = false;
      }
      else {
        pTVar7 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullstatementMap,this->m_statementIndex + -1);
        pSVar8 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar7);
        iVar6 = (pSVar8->byteCodeSpan).end + 1;
        this->m_nextStatementBoundary = this->m_startLocation + iVar6;
        FunctionBody::
        GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                  (this->m_fullstatementMap,&this->m_statementIndex);
        pTVar7 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullstatementMap,this->m_statementIndex);
        pSVar8 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar7);
        if (iVar6 == (pSVar8->byteCodeSpan).begin) {
          nextMap._4_4_ = this->m_statementIndex;
        }
        else {
          this->m_startOfStatement = false;
        }
      }
    }
    else {
      this->m_nextStatementBoundary = this->m_startLocation + (int)retStatement;
      nextMap._4_4_ = this->m_statementIndex;
    }
  }
  return nextMap._4_4_;
}

Assistant:

uint32 StatementReader<TStatementMapList>::MoveNextStatementBoundary()
    {
        StatementData data;
        uint32 retStatement = Js::Constants::NoStatementIndex;

        if (m_startOfStatement)
        {
            m_statementIndex++;
            if (m_statementMap && (uint32)m_statementIndex < m_statementMap->Count() && m_statementMap->Item(m_statementIndex, m_statementMapIter, data))
            {
                // The end boundary is the last byte of the last instruction in the previous range.
                // We want to track the beginning of the next instruction for AtStatementBoundary.
                m_nextStatementBoundary = m_startLocation + data.bytecodeBegin;

                // The next user statement is adjacent in the bytecode
                retStatement = m_statementIndex;
            }
            else if (m_fullstatementMap && m_statementIndex < m_fullstatementMap->Count())
            {
                int nextInstrStart = m_fullstatementMap->Item(m_statementIndex - 1)->byteCodeSpan.end + 1;
                m_nextStatementBoundary = m_startLocation + nextInstrStart;
                Js::FunctionBody::GetNextNonSubexpressionStatementMap(m_fullstatementMap, m_statementIndex);

                if (nextInstrStart == m_fullstatementMap->Item(m_statementIndex)->byteCodeSpan.begin)
                {
                    retStatement = m_statementIndex;
                }
                else
                {
                    m_startOfStatement = false;
                }
            }
            else
            {
                m_startOfStatement = false;
            }
        }
        else
        {
            m_startOfStatement = true;
            if (m_statementMap && (uint32)m_statementIndex < m_statementMap->Count() && m_statementMap->Item(m_statementIndex, m_statementMapIter, data))
            {
                // Start a range of bytecode that maps to a user statement
                m_nextStatementBoundary = m_startLocation + data.bytecodeBegin;
                retStatement = m_statementIndex;
            }
            else if (m_fullstatementMap && m_statementIndex < m_fullstatementMap->Count())
            {
                FunctionBody::StatementMap *nextMap = Js::FunctionBody::GetNextNonSubexpressionStatementMap(m_fullstatementMap, m_statementIndex);
                if (!nextMap)
                {
                    // set to a location that will never match
                    m_nextStatementBoundary = m_startLocation - 1;
                }
                else
                {
                    // Start a range of bytecode that maps to a user statement
                    m_nextStatementBoundary = m_startLocation + m_fullstatementMap->Item(m_statementIndex)->byteCodeSpan.begin;
                    retStatement = m_statementIndex;
                }
            }
            else
            {
                // The remaining bytecode instructions do not map to a user statement, set a statementBoundary that cannot match
                m_nextStatementBoundary = m_startLocation - 1;
            }
        }

        return retStatement;
    }